

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAnalyzeAggList(NameContext *pNC,ExprList *pList)

{
  int local_24;
  ExprList_item *pEStack_20;
  int i;
  ExprList_item *pItem;
  ExprList *pList_local;
  NameContext *pNC_local;
  
  if (pList != (ExprList *)0x0) {
    pEStack_20 = pList->a;
    for (local_24 = 0; local_24 < pList->nExpr; local_24 = local_24 + 1) {
      sqlite3ExprAnalyzeAggregates(pNC,pEStack_20->pExpr);
      pEStack_20 = pEStack_20 + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggList(NameContext *pNC, ExprList *pList){
  struct ExprList_item *pItem;
  int i;
  if( pList ){
    for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
      sqlite3ExprAnalyzeAggregates(pNC, pItem->pExpr);
    }
  }
}